

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall
CTcSymLocalBase::convert_to_ctx_var(CTcSymLocalBase *this,int val_used,int val_assigned)

{
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  
  if ((*(ushort *)((long)in_RDI + 100) >> 4 & 1) == 0) {
    *(ushort *)((long)in_RDI + 100) = *(ushort *)((long)in_RDI + 100) & 0xffef | 0x10;
    *(undefined4 *)(in_RDI + 8) = 0;
    *(undefined4 *)(in_RDI + 9) = 0;
  }
  (**(code **)(*in_RDI + 0x78))();
  if (in_ESI != 0) {
    set_val_used((CTcSymLocalBase *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RDI >> 0x20));
  }
  if (in_EDX != 0) {
    set_val_assigned((CTcSymLocalBase *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RDI >> 0x20));
  }
  if (in_RDI[10] != 0) {
    convert_to_ctx_var((CTcSymLocalBase *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RDI >> 0x20),
                       (int)in_RDI);
  }
  return;
}

Assistant:

void CTcSymLocalBase::convert_to_ctx_var(int val_used, int val_assigned)
{
    /* if I'm not already a context local, mark me as a context local */
    if (!is_ctx_local_)
    {
        /* mark myself as a context local */
        is_ctx_local_ = TRUE;

        /* 
         *   we haven't yet assigned our local context variable, since
         *   we're still processing the inner scope at this point; just
         *   store placeholders for now so we know to come back and fix
         *   this up 
         */
        ctx_var_num_ = 0;
        ctx_arr_idx_ = 0;
    }

    /* note that I've been referenced */
    mark_referenced();

    /* propagate the value-used and value-assigned flags */
    if (val_used)
        set_val_used(TRUE);
    if (val_assigned)
        set_val_assigned(TRUE);
        
    /* propagate the conversion to the original symbol */
    if (ctx_orig_ != 0)
        ctx_orig_->convert_to_ctx_var(val_used, val_assigned);
}